

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDD mtbdd_set_remove(MTBDD set,uint32_t var)

{
  uint32_t var_00;
  mtbddnode_t n;
  MTBDD set_00;
  MTBDD high;
  undefined8 local_48;
  MTBDD res;
  MTBDD sub;
  uint32_t set_var;
  mtbddnode_t set_node;
  uint32_t var_local;
  MTBDD set_local;
  
  if (set == 0x8000000000000000) {
    set_local = 0x8000000000000000;
  }
  else {
    n = MTBDD_GETNODE(set);
    var_00 = mtbddnode_getvariable(n);
    set_local = set;
    if (var_00 <= var) {
      if (var_00 == var) {
        set_local = mtbddnode_followhigh(set,n);
      }
      else {
        set_00 = mtbddnode_followhigh(set,n);
        high = mtbdd_set_remove(set_00,var);
        local_48 = set;
        if (set_00 != high) {
          local_48 = mtbdd_makenode(var_00,0,high);
        }
        set_local = local_48;
      }
    }
  }
  return set_local;
}

Assistant:

MTBDD
mtbdd_set_remove(MTBDD set, uint32_t var)
{
    if (set == mtbdd_true) return mtbdd_true;

    mtbddnode_t set_node = MTBDD_GETNODE(set);
    uint32_t set_var = mtbddnode_getvariable(set_node);
    if (var < set_var) return set;
    else if (set_var == var) return mtbddnode_followhigh(set, set_node);
    else {
        MTBDD sub = mtbddnode_followhigh(set, set_node);
        MTBDD res = mtbdd_set_remove(sub, var);
        res = sub == res ? set : mtbdd_makenode(set_var, mtbdd_false, res);
        return res;
    }
}